

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O1

UChar * __thiscall
icu_63::Normalizer2Impl::makeFCD
          (Normalizer2Impl *this,UChar *src,UChar *limit,ReorderingBuffer *buffer,
          UErrorCode *errorCode)

{
  UChar UVar1;
  bool bVar2;
  UBool UVar3;
  byte bVar4;
  uint16_t uVar5;
  uint16_t uVar6;
  uint uVar7;
  uint uVar8;
  UChar *pUVar9;
  long lVar10;
  UChar *pUVar11;
  uint c;
  UChar *prevSrc;
  UChar *local_60;
  UChar *local_48;
  
  c = 0;
  local_60 = src;
  if (limit == (UChar *)0x0) {
    lVar10 = 2;
    pUVar11 = src + -2;
    do {
      pUVar9 = pUVar11;
      pUVar11 = pUVar9 + 1;
      lVar10 = lVar10 + -2;
      if (pUVar9[2] == L'\0') break;
    } while ((ushort)pUVar9[2] < (ushort)this->minLcccCP);
    pUVar9 = pUVar9 + 2;
    if (buffer != (ReorderingBuffer *)0x0 && lVar10 != 0) {
      ReorderingBuffer::appendZeroCC(buffer,src,pUVar9,errorCode);
    }
    if (U_ZERO_ERROR < *errorCode) {
      return pUVar9;
    }
    uVar8 = 0;
    if (src < pUVar9) {
      uVar5 = getFCD16(this,(uint)(ushort)*pUVar11);
      local_60 = pUVar11;
      if (uVar5 < 2) {
        local_60 = pUVar9;
      }
      uVar8 = (uint)uVar5;
    }
    limit = u_strchr_63(pUVar9,L'\0');
  }
  else {
    uVar8 = 0;
    pUVar9 = src;
  }
  uVar5 = 0;
  local_48 = pUVar9;
joined_r0x002ab08e:
  bVar2 = pUVar9 == limit;
  if (!bVar2) {
    UVar1 = *pUVar9;
    c = (uint)(ushort)UVar1;
    if ((ushort)UVar1 < (ushort)this->minLcccCP) {
      pUVar9 = pUVar9 + 1;
      uVar8 = ~c;
      goto joined_r0x002ab08e;
    }
    if ((this->smallFCD[(ushort)UVar1 >> 8] == 0) ||
       ((ushort)((ushort)(1 << ((byte)UVar1 >> 5)) & (ushort)this->smallFCD[(ushort)UVar1 >> 8]) ==
        0)) {
      pUVar9 = pUVar9 + 1;
      uVar8 = 0;
      goto joined_r0x002ab08e;
    }
    if ((((c & 0xfc00) == 0xd800) && (pUVar9 + 1 != limit)) &&
       (uVar7 = (uint)(ushort)pUVar9[1], (uVar7 & 0xfc00) == 0xdc00)) {
      c = c * 0x400 + uVar7 + 0xfca02400;
    }
    uVar5 = getFCD16FromNormData(this,c);
    if (uVar5 < 0x100) {
      pUVar9 = pUVar9 + (2 - (c < 0x10000));
      uVar8 = (uint)uVar5;
      goto joined_r0x002ab08e;
    }
  }
  if (pUVar9 == local_48) {
    bVar4 = (byte)uVar8;
    if (bVar2) {
      return pUVar9;
    }
  }
  else {
    if (buffer != (ReorderingBuffer *)0x0) {
      UVar3 = ReorderingBuffer::appendZeroCC(buffer,local_48,pUVar9,errorCode);
      bVar2 = bVar2 || UVar3 == '\0';
    }
    if (bVar2) {
      return pUVar9;
    }
    if ((int)uVar8 < 0) {
      bVar4 = 0;
      local_60 = pUVar9;
      local_48 = pUVar9;
      if ((int)~uVar8 < (int)(uint)(ushort)this->minDecompNoCP) goto LAB_002ab2a8;
      uVar6 = getFCD16FromNormData(this,~uVar8);
      uVar8 = (uint)uVar6;
      local_60 = pUVar9 + ((ulong)(uVar6 < 2) - 1);
    }
    else {
      local_60 = pUVar9 + -1;
      if ((local_48 < local_60 && (pUVar9[-1] & 0xfc00U) == 0xdc00) &&
         ((pUVar9[-2] & 0xfc00U) == 0xd800)) {
        local_60 = pUVar9 + -2;
        uVar6 = getFCD16FromNormData
                          (this,(uint)(ushort)pUVar9[-1] + (uint)(ushort)pUVar9[-2] * 0x400 +
                                -0x35fdc00);
        uVar8 = (uint)uVar6;
      }
      if ((int)uVar8 < 2) {
        local_60 = pUVar9;
      }
    }
    bVar4 = (byte)uVar8;
    local_48 = pUVar9;
  }
LAB_002ab2a8:
  pUVar9 = pUVar9 + (2 - (c < 0x10000));
  if ((byte)(uVar5 >> 8) < bVar4) {
    if (buffer == (ReorderingBuffer *)0x0) {
      return local_60;
    }
    ReorderingBuffer::removeSuffix(buffer,(int32_t)((ulong)((long)local_48 - (long)local_60) >> 1));
    pUVar9 = findNextFCDBoundary(this,pUVar9,limit);
    decomposeShort(this,local_60,pUVar9,'\0','\0',buffer,errorCode);
    uVar8 = 0;
    local_60 = pUVar9;
    local_48 = pUVar9;
    if (U_ZERO_ERROR < *errorCode) {
      return pUVar9;
    }
  }
  else {
    if ((uVar5 & 0xfe) == 0) {
      local_60 = pUVar9;
    }
    uVar8 = (uint)uVar5;
    local_48 = pUVar9;
    if ((buffer != (ReorderingBuffer *)0x0) &&
       (UVar3 = ReorderingBuffer::appendZeroCC(buffer,c,errorCode), UVar3 == '\0')) {
      return pUVar9;
    }
  }
  goto joined_r0x002ab08e;
}

Assistant:

const UChar *
Normalizer2Impl::makeFCD(const UChar *src, const UChar *limit,
                         ReorderingBuffer *buffer,
                         UErrorCode &errorCode) const {
    // Tracks the last FCD-safe boundary, before lccc=0 or after properly-ordered tccc<=1.
    // Similar to the prevBoundary in the compose() implementation.
    const UChar *prevBoundary=src;
    int32_t prevFCD16=0;
    if(limit==NULL) {
        src=copyLowPrefixFromNulTerminated(src, minLcccCP, buffer, errorCode);
        if(U_FAILURE(errorCode)) {
            return src;
        }
        if(prevBoundary<src) {
            prevBoundary=src;
            // We know that the previous character's lccc==0.
            // Fetching the fcd16 value was deferred for this below-U+0300 code point.
            prevFCD16=getFCD16(*(src-1));
            if(prevFCD16>1) {
                --prevBoundary;
            }
        }
        limit=u_strchr(src, 0);
    }

    // Note: In this function we use buffer->appendZeroCC() because we track
    // the lead and trail combining classes here, rather than leaving it to
    // the ReorderingBuffer.
    // The exception is the call to decomposeShort() which uses the buffer
    // in the normal way.

    const UChar *prevSrc;
    UChar32 c=0;
    uint16_t fcd16=0;

    for(;;) {
        // count code units with lccc==0
        for(prevSrc=src; src!=limit;) {
            if((c=*src)<minLcccCP) {
                prevFCD16=~c;
                ++src;
            } else if(!singleLeadMightHaveNonZeroFCD16(c)) {
                prevFCD16=0;
                ++src;
            } else {
                if(U16_IS_LEAD(c)) {
                    UChar c2;
                    if((src+1)!=limit && U16_IS_TRAIL(c2=src[1])) {
                        c=U16_GET_SUPPLEMENTARY(c, c2);
                    }
                }
                if((fcd16=getFCD16FromNormData(c))<=0xff) {
                    prevFCD16=fcd16;
                    src+=U16_LENGTH(c);
                } else {
                    break;
                }
            }
        }
        // copy these code units all at once
        if(src!=prevSrc) {
            if(buffer!=NULL && !buffer->appendZeroCC(prevSrc, src, errorCode)) {
                break;
            }
            if(src==limit) {
                break;
            }
            prevBoundary=src;
            // We know that the previous character's lccc==0.
            if(prevFCD16<0) {
                // Fetching the fcd16 value was deferred for this below-minLcccCP code point.
                UChar32 prev=~prevFCD16;
                if(prev<minDecompNoCP) {
                    prevFCD16=0;
                } else {
                    prevFCD16=getFCD16FromNormData(prev);
                    if(prevFCD16>1) {
                        --prevBoundary;
                    }
                }
            } else {
                const UChar *p=src-1;
                if(U16_IS_TRAIL(*p) && prevSrc<p && U16_IS_LEAD(*(p-1))) {
                    --p;
                    // Need to fetch the previous character's FCD value because
                    // prevFCD16 was just for the trail surrogate code point.
                    prevFCD16=getFCD16FromNormData(U16_GET_SUPPLEMENTARY(p[0], p[1]));
                    // Still known to have lccc==0 because its lead surrogate unit had lccc==0.
                }
                if(prevFCD16>1) {
                    prevBoundary=p;
                }
            }
            // The start of the current character (c).
            prevSrc=src;
        } else if(src==limit) {
            break;
        }

        src+=U16_LENGTH(c);
        // The current character (c) at [prevSrc..src[ has a non-zero lead combining class.
        // Check for proper order, and decompose locally if necessary.
        if((prevFCD16&0xff)<=(fcd16>>8)) {
            // proper order: prev tccc <= current lccc
            if((fcd16&0xff)<=1) {
                prevBoundary=src;
            }
            if(buffer!=NULL && !buffer->appendZeroCC(c, errorCode)) {
                break;
            }
            prevFCD16=fcd16;
            continue;
        } else if(buffer==NULL) {
            return prevBoundary;  // quick check "no"
        } else {
            /*
             * Back out the part of the source that we copied or appended
             * already but is now going to be decomposed.
             * prevSrc is set to after what was copied/appended.
             */
            buffer->removeSuffix((int32_t)(prevSrc-prevBoundary));
            /*
             * Find the part of the source that needs to be decomposed,
             * up to the next safe boundary.
             */
            src=findNextFCDBoundary(src, limit);
            /*
             * The source text does not fulfill the conditions for FCD.
             * Decompose and reorder a limited piece of the text.
             */
            decomposeShort(prevBoundary, src, FALSE, FALSE, *buffer, errorCode);
            if (U_FAILURE(errorCode)) {
                break;
            }
            prevBoundary=src;
            prevFCD16=0;
        }
    }
    return src;
}